

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall hello::hello_world(hello *this)

{
  int iVar1;
  cookie *pcVar2;
  ostream *poVar3;
  basic_format<char> *pbVar4;
  long *plVar5;
  info *piVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  string t1;
  string t3;
  string t2;
  ostringstream ss;
  allocator local_479;
  basic_message<char> local_478;
  streamable local_3f8;
  string local_3d8 [32];
  basic_format<char> local_3b8;
  time_t local_270;
  string_type local_268;
  string_type local_248;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  time((time_t *)0x0);
  std::ostream::_M_insert<long>((long)local_1a8);
  pcVar2 = (cookie *)cppcms::application::response();
  std::__cxx11::string::string(local_1c8,"test",(allocator *)&local_478);
  std::__cxx11::stringbuf::str();
  cppcms::http::cookie::cookie((cookie *)&local_3b8,local_1c8,local_1e8);
  cppcms::http::response::set_cookie(pcVar2);
  cppcms::http::cookie::~cookie((cookie *)&local_3b8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"<html><body>\n<h1>Hello World!</h1>\n");
  std::__cxx11::string::string(local_3d8,"text",(allocator *)&local_3b8);
  std::__cxx11::string::string(local_208,"text text",(allocator *)&local_3b8);
  std::__cxx11::string::string(local_228,"<text>",(allocator *)&local_3b8);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  local_3f8.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>((streamable *)&local_478,(long *)&local_3f8);
  cppcms::filters::date::date((date *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::date::operator()((date *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::date::~date((date *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  local_3f8.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>((streamable *)&local_478,(long *)&local_3f8);
  cppcms::filters::time::time((time *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::time::operator()((time *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::time::~time((time *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  local_3f8.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>((streamable *)&local_478,(long *)&local_3f8);
  cppcms::filters::datetime::datetime((datetime *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::datetime::operator()((datetime *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::datetime::~datetime((datetime *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_3d8);
  cppcms::filters::to_upper::to_upper((to_upper *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::to_upper::operator()((to_upper *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::to_upper::~to_upper((to_upper *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_3d8);
  cppcms::filters::to_lower::to_lower((to_lower *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::to_lower::operator()((to_lower *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::to_lower::~to_lower((to_lower *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_3d8);
  cppcms::filters::to_title::to_title((to_title *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::to_title::operator()((to_title *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::to_title::~to_title((to_title *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_228);
  cppcms::filters::escape::escape((escape *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::escape::operator()((escape *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::escape::~escape((escape *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_208);
  cppcms::filters::urlencode::urlencode((urlencode *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::urlencode::operator()((urlencode *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::urlencode::~urlencode((urlencode *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::filters::streamable::streamable<std::__cxx11::string>((streamable *)&local_478,local_3d8);
  cppcms::filters::base64_urlencode::base64_urlencode
            ((base64_urlencode *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::base64_urlencode::operator()((base64_urlencode *)&local_3b8,poVar3);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::base64_urlencode::~base64_urlencode((base64_urlencode *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::__cxx11::string::string((string *)&local_248,"{1,datetime=f}",(allocator *)&local_3f8);
  booster::locale::basic_format<char>::basic_format(&local_3b8,&local_248);
  local_478._0_8_ = time((time_t *)0x0);
  pbVar4 = booster::locale::basic_format<char>::operator%(&local_3b8,(long *)&local_478);
  booster::locale::basic_format<char>::write(pbVar4,(int)poVar3,__buf,in_RCX);
  std::operator<<(poVar3,"<br>\n");
  booster::locale::basic_format<char>::~basic_format(&local_3b8);
  std::__cxx11::string::~string((string *)&local_248);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::__cxx11::string::string((string *)&local_268,"{1,datetime=f}",&local_479);
  booster::locale::basic_format<char>::basic_format(&local_3b8,&local_268);
  local_270 = time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>(&local_3f8,&local_270);
  cppcms::filters::escape::escape((escape *)&local_478,&local_3f8);
  pbVar4 = booster::locale::basic_format<char>::operator%(&local_3b8,(escape *)&local_478);
  booster::locale::basic_format<char>::write(pbVar4,(int)poVar3,__buf_00,in_RCX);
  std::operator<<(poVar3,"<br>\n");
  cppcms::filters::escape::~escape((escape *)&local_478);
  cppcms::filters::streamable::~streamable(&local_3f8);
  booster::locale::basic_format<char>::~basic_format(&local_3b8);
  std::__cxx11::string::~string((string *)&local_268);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  cppcms::application::response();
  plVar5 = (long *)cppcms::http::response::out();
  std::locale::locale((locale *)&local_478,
                      (locale *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0xd0));
  piVar6 = std::use_facet<booster::locale::info>((locale *)&local_478);
  (**(code **)(*(long *)piVar6 + 0x10))(&local_3b8,piVar6,0);
  poVar3 = std::operator<<(poVar3,(string *)&local_3b8);
  std::operator<<(poVar3,"<br>\n");
  std::__cxx11::string::~string((string *)&local_3b8);
  std::locale::~locale((locale *)&local_478);
  cppcms::application::request();
  lVar7 = cppcms::http::request::cookies_abi_cxx11_();
  p_Var8 = *(_Rb_tree_node_base **)(lVar7 + 0x18);
  while( true ) {
    cppcms::application::request();
    lVar7 = cppcms::http::request::cookies_abi_cxx11_();
    if (p_Var8 == (_Rb_tree_node_base *)(lVar7 + 8)) break;
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    poVar3 = (ostream *)cppcms::http::operator<<(poVar3,(cookie *)(p_Var8 + 2));
    std::operator<<(poVar3,"<br/>\n");
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  local_3f8.ptr_ = (void *)time((time_t *)0x0);
  cppcms::filters::streamable::streamable<long>((streamable *)&local_478,(long *)&local_3f8);
  cppcms::filters::date::date((date *)&local_3b8,(streamable *)&local_478);
  cppcms::filters::date::operator()((date *)&local_3b8,poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  cppcms::filters::date::~date((date *)&local_3b8);
  cppcms::filters::streamable::~streamable((streamable *)&local_478);
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  local_3b8.message_.id_._M_dataplus._M_p = (pointer)&local_3b8.message_.id_.field_2;
  local_3b8.message_.n_ = 0;
  local_3b8.message_.c_id_ = "hello\n";
  local_3b8.message_.c_context_ = (char_type *)0x0;
  local_3b8.message_.c_plural_ = (char_type *)0x0;
  local_3b8.message_.id_._M_string_length = 0;
  __n = 0;
  local_3b8.message_.id_.field_2._M_local_buf[0] = '\0';
  local_3b8.message_.context_._M_dataplus._M_p = (pointer)&local_3b8.message_.context_.field_2;
  local_3b8.message_.context_._M_string_length = 0;
  local_3b8.message_.context_.field_2._M_local_buf[0] = '\0';
  local_3b8.message_.plural_._M_dataplus._M_p = (pointer)&local_3b8.message_.plural_.field_2;
  local_3b8.message_.plural_._M_string_length = 0;
  local_3b8.message_.plural_.field_2._M_local_buf[0] = '\0';
  cppcms::filters::streamable::streamable<booster::locale::basic_message<char>>
            (&local_3f8,&local_3b8.message_);
  cppcms::filters::escape::escape((escape *)&local_478,&local_3f8);
  cppcms::filters::escape::operator()((escape *)&local_478,poVar3);
  std::operator<<(poVar3,"<br>");
  cppcms::filters::escape::~escape((escape *)&local_478);
  cppcms::filters::streamable::~streamable(&local_3f8);
  booster::locale::basic_message<char>::~basic_message(&local_3b8.message_);
  iVar1 = 0;
  while (local_3f8.ptr_ = (void *)CONCAT44(local_3f8.ptr_._4_4_,iVar1), iVar1 < 0x1e) {
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    local_478.n_ = (int)local_3f8.ptr_;
    local_478.c_id_ = "passed one day";
    local_478.c_context_ = (char_type *)0x0;
    local_478.c_plural_ = "passed {1} days";
    local_478.id_._M_dataplus._M_p = (pointer)&local_478.id_.field_2;
    local_478.id_._M_string_length = 0;
    local_478.id_.field_2._M_local_buf[0] = '\0';
    local_478.context_._M_dataplus._M_p = (pointer)&local_478.context_.field_2;
    local_478.context_._M_string_length = 0;
    local_478.context_.field_2._M_local_buf[0] = '\0';
    local_478.plural_._M_dataplus._M_p = (pointer)&local_478.plural_.field_2;
    local_478.plural_._M_string_length = 0;
    local_478.plural_.field_2._M_local_buf[0] = '\0';
    booster::locale::basic_format<char>::basic_format(&local_3b8,&local_478);
    pbVar4 = booster::locale::basic_format<char>::operator%(&local_3b8,(int *)&local_3f8);
    booster::locale::basic_format<char>::write(pbVar4,(int)poVar3,__buf_01,__n);
    std::operator<<(poVar3,"<br>\n");
    booster::locale::basic_format<char>::~basic_format(&local_3b8);
    booster::locale::basic_message<char>::~basic_message(&local_478);
    iVar1 = (int)local_3f8.ptr_ + 1;
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar3,"<body></html>\n");
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_3d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void hello_world()
	{
		using namespace cppcms;
		std::ostringstream ss;
		ss<<std::time(NULL);
		response().set_cookie(cppcms::http::cookie("test",ss.str()));
		response().out() <<
			"<html><body>\n"
			"<h1>Hello World!</h1>\n";
		std::string t1="text";
		std::string t2="text text";
		std::string t3="<text>";
		response().out()<<cppcms::filters::date(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::time(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::datetime(time(0)) << "<br>\n";
		response().out()<<cppcms::filters::to_upper(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_lower(t1) << "<br>\n";
		response().out()<<cppcms::filters::to_title(t1) << "<br>\n";
		response().out()<<cppcms::filters::escape(t3) << "<br>\n";
		response().out()<<cppcms::filters::urlencode(t2) << "<br>\n";
		response().out()<<cppcms::filters::base64_urlencode(t1) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % time(0) << "<br>\n";
		response().out()<<locale::format("{1,datetime=f}") % cppcms::filters::escape(time(0)) << "<br>\n";
		response().out()<<std::use_facet<locale::info>(response().out().getloc()).language()<<"<br>\n";
		cppcms::http::request::cookies_type::const_iterator p;
		for(p=request().cookies().begin();p!=request().cookies().end();++p) {
			response().out()<<p->second<<"<br/>\n";
		}

		response().out() << filters::date(time(0)) <<std::endl;

		response().out() << filters::escape(locale::translate("hello\n")) << "<br>";
		
		for(int i=0;i<30;i++) {
			response().out() << locale::format(locale::translate("passed one day","passed {1} days",i)) % i << "<br>\n";
		}
		response().out()
			<<"<body></html>\n";

	}